

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O1

int FmsIOGetScalarArray(FmsIOContext *ctx,char *path,FmsScalarType *type,void **values,FmsInt *n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulonglong uVar5;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  float fVar12;
  double dVar13;
  char *newoff;
  char v [512];
  char k [512];
  char *local_450;
  ulong local_448;
  void **local_440;
  char local_438 [512];
  char local_238 [520];
  
  if (ctx == (FmsIOContext *)0x0) {
    return 1;
  }
  if (path == (char *)0x0) {
    return 2;
  }
  if (type == (FmsScalarType *)0x0) {
    return 3;
  }
  if (values == (void **)0x0) {
    return 4;
  }
  if (n == (FmsInt *)0x0) {
    return 5;
  }
  iVar1 = FmsIOReadKeyValue(ctx,local_238,local_438);
  if (iVar1 != 0) {
    return 6;
  }
  local_440 = values;
  pcVar4 = join_keys(path,"Size");
  iVar1 = strcmp(local_238,pcVar4);
  if (pcVar4 != (char *)0x0) {
    free(pcVar4);
  }
  if (iVar1 == 0) {
    bVar11 = false;
    uVar5 = strtoull(local_438,(char **)0x0,10);
    *n = uVar5;
    piVar6 = __errno_location();
    if (*piVar6 == 0x22) {
      iVar1 = 8;
      goto LAB_0010ecf7;
    }
    if (*piVar6 != 0x16) {
      bVar11 = true;
      iVar1 = 0;
      goto LAB_0010ecf7;
    }
    iVar1 = 9;
  }
  else {
    iVar1 = 7;
  }
  bVar11 = false;
LAB_0010ecf7:
  iVar3 = iVar1;
  if (bVar11) {
    iVar2 = FmsIOReadKeyValue(ctx,local_238,local_438);
    iVar3 = 10;
    if (iVar2 == 0) {
      pcVar4 = join_keys(path,"Type");
      iVar3 = strcmp(local_238,pcVar4);
      if (pcVar4 != (char *)0x0) {
        free(pcVar4);
      }
      if (iVar3 == 0) {
        iVar3 = FmsGetScalarTypeFromName(local_438,type);
        bVar11 = iVar3 == 0;
        iVar3 = 0xc;
        if (bVar11) {
          iVar3 = iVar1;
        }
      }
      else {
        bVar11 = false;
        iVar3 = 0xb;
      }
      if ((bVar11) && (iVar3 = 0, *n != 0)) {
        iVar1 = FmsIOReadKeyValue(ctx,local_238,local_438);
        iVar3 = 0xe;
        if (iVar1 == 0) {
          pcVar4 = join_keys(path,"Values");
          iVar1 = strcmp(local_238,pcVar4);
          if (pcVar4 != (char *)0x0) {
            free(pcVar4);
          }
          iVar3 = 0xf;
          if (iVar1 == 0) {
            switch(*type) {
            case FMS_FLOAT:
              pvVar7 = malloc(*n << 2);
              local_448 = 0;
              do {
                uVar9 = local_448;
                sVar8 = strlen(local_438);
                local_450 = (char *)0x0;
                pcVar4 = local_438 + (local_438[0] == '[');
                do {
                  uVar10 = local_448;
                  if ((sVar8 == 0) || (uVar10 = uVar9, *n <= uVar9)) break;
                  fVar12 = strtof(pcVar4,&local_450);
                  *(float *)((long)pvVar7 + uVar9 * 4) = fVar12;
                  pcVar4 = local_450 + 1;
                  if (local_450[1] == ' ') {
                    pcVar4 = local_450 + 2;
                  }
                  local_450 = pcVar4;
                  uVar9 = uVar9 + 1;
                  uVar10 = uVar9;
                  pcVar4 = local_450;
                } while (local_450 < local_438 + sVar8);
                pcVar4 = strchr(local_438,0x5d);
              } while ((pcVar4 == (char *)0x0) &&
                      (iVar1 = FmsIOReadLine(ctx,local_438), local_448 = uVar10, iVar1 == 0));
              break;
            case FMS_DOUBLE:
              pvVar7 = malloc(*n << 3);
              local_448 = 0;
              do {
                uVar9 = local_448;
                sVar8 = strlen(local_438);
                local_450 = (char *)0x0;
                pcVar4 = local_438 + (local_438[0] == '[');
                do {
                  uVar10 = local_448;
                  if ((sVar8 == 0) || (uVar10 = uVar9, *n <= uVar9)) break;
                  dVar13 = strtod(pcVar4,&local_450);
                  *(double *)((long)pvVar7 + uVar9 * 8) = dVar13;
                  pcVar4 = local_450 + 1;
                  if (local_450[1] == ' ') {
                    pcVar4 = local_450 + 2;
                  }
                  local_450 = pcVar4;
                  uVar9 = uVar9 + 1;
                  uVar10 = uVar9;
                  pcVar4 = local_450;
                } while (local_450 < local_438 + sVar8);
                pcVar4 = strchr(local_438,0x5d);
              } while ((pcVar4 == (char *)0x0) &&
                      (iVar1 = FmsIOReadLine(ctx,local_438), local_448 = uVar10, iVar1 == 0));
              break;
            case FMS_COMPLEX_FLOAT:
              pvVar7 = malloc(*n << 3);
              local_448 = 0;
              do {
                uVar9 = local_448;
                sVar8 = strlen(local_438);
                local_450 = (char *)0x0;
                pcVar4 = local_438 + (local_438[0] == '[');
                do {
                  uVar10 = local_448;
                  if ((sVar8 == 0) || (uVar10 = uVar9, *n * 2 <= uVar9)) break;
                  fVar12 = strtof(pcVar4,&local_450);
                  *(float *)((long)pvVar7 + uVar9 * 4) = fVar12;
                  pcVar4 = local_450 + 1;
                  if (local_450[1] == ' ') {
                    pcVar4 = local_450 + 2;
                  }
                  local_450 = pcVar4;
                  uVar9 = uVar9 + 1;
                  uVar10 = uVar9;
                  pcVar4 = local_450;
                } while (local_450 < local_438 + sVar8);
                pcVar4 = strchr(local_438,0x5d);
              } while ((pcVar4 == (char *)0x0) &&
                      (iVar1 = FmsIOReadLine(ctx,local_438), local_448 = uVar10, iVar1 == 0));
              break;
            case FMS_COMPLEX_DOUBLE:
              pvVar7 = malloc(*n << 4);
              local_448 = 0;
              do {
                uVar9 = local_448;
                sVar8 = strlen(local_438);
                local_450 = (char *)0x0;
                pcVar4 = local_438 + (local_438[0] == '[');
                do {
                  uVar10 = local_448;
                  if ((sVar8 == 0) || (uVar10 = uVar9, *n * 2 <= uVar9)) break;
                  dVar13 = strtod(pcVar4,&local_450);
                  *(double *)((long)pvVar7 + uVar9 * 8) = dVar13;
                  pcVar4 = local_450 + 1;
                  if (local_450[1] == ' ') {
                    pcVar4 = local_450 + 2;
                  }
                  local_450 = pcVar4;
                  uVar9 = uVar9 + 1;
                  uVar10 = uVar9;
                  pcVar4 = local_450;
                } while (local_450 < local_438 + sVar8);
                pcVar4 = strchr(local_438,0x5d);
              } while ((pcVar4 == (char *)0x0) &&
                      (iVar1 = FmsIOReadLine(ctx,local_438), local_448 = uVar10, iVar1 == 0));
              break;
            default:
              return 0x10;
            }
            *local_440 = pvVar7;
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
FmsIOGetScalarArray(FmsIOContext *ctx, const char *path, FmsScalarType *type,
                    void **values, FmsInt *n) {
  int err = 0;
  char k[FMS_BUFFER_SIZE], v[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  if(!type) E_RETURN(3);
  if(!values) E_RETURN(4);
  if(!n) E_RETURN(5);

  /* Arrays are written like:
      path/Size: n
      path/Type: type
      path/Values: [1,2,3,
      4,5,6
      7,8,9]
  */

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(6);

    char *ksize = join_keys(path, "Size");
    err = strcmp(k, ksize);
    FREE(ksize);
    // Path & key didn't match
    if(err)
      E_RETURN(7);

    *n = StrToFmsInt(v, NULL, 10);

    if (errno == ERANGE) { E_RETURN(8); }
    if (errno == EINVAL) { E_RETURN(9); }
  }

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(10);

    char *ktype= join_keys(path, "Type");
    err = strcmp(k, ktype);
    FREE(ktype);
    // Path & key didn't match
    if(err)
      E_RETURN(11);

    if(FmsGetScalarTypeFromName(v, type))
      E_RETURN(12);
  }

  // Values does not get written if Size == 0
  if(*n == 0)
    return 0;

  if(FmsIOReadKeyValue(ctx, k, v))
    E_RETURN(14);

  char *kvalues = join_keys(path, "Values");
  err = strcmp(k, kvalues);
  FREE(kvalues);
  if(err)
    E_RETURN(15);

// Had to remake this for scalar because strto(f/d) doesn't take a base
#define READ_ARRAY_DATA(DEST_T, FUNC, SIZE) \
do { \
    DEST_T *data = malloc(sizeof(DEST_T) * SIZE); \
    FmsInt i = 0; \
    while(1) { \
        size_t len = strlen(v); \
        char *off = v, *newoff = NULL; \
        if(off[0] == '[') \
            off++; \
        while(len && i < SIZE) { \
            data[i++] = (DEST_T)FUNC(off, &newoff); \
            newoff++; \
            if(*newoff == ' ') newoff++; /* Current flaw in the file format, last element has no trialing space */ \
            if(newoff >= v + len) break; \
            off = newoff; \
        }